

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase445::run(TestCase445 *this)

{
  bool bVar1;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *pOVar2;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> OVar3;
  bool local_375;
  int local_374;
  bool _kj_shouldLog_10;
  DebugExpression<unsigned_int_&> DStack_370;
  undefined1 local_368 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_10;
  bool _kj_shouldLog_9;
  DebugExpression<unsigned_int_&> DStack_338;
  undefined1 local_330 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_9;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int_&> DStack_300;
  undefined1 local_2f8 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_8;
  bool _kj_shouldLog_7;
  DebugExpression<unsigned_int_&> DStack_2c8;
  undefined1 local_2c0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_7;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int_&> DStack_290;
  undefined1 local_288 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_6;
  bool _kj_shouldLog_5;
  DebugExpression<unsigned_int_&> DStack_258;
  undefined1 local_250 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_5;
  void *pvStack_220;
  bool _kj_shouldLog_4;
  DestructionOrderRecorder *local_218;
  DestructionOrderRecorder *local_210;
  undefined1 local_208 [8];
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
  _kjCondition_4;
  void *pvStack_1d8;
  bool _kj_shouldLog_3;
  DestructionOrderRecorder *local_1d0;
  DestructionOrderRecorder *local_1c8;
  undefined1 local_1c0 [8];
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
  _kjCondition_3;
  void *pvStack_190;
  bool _kj_shouldLog_2;
  DestructionOrderRecorder *local_188;
  DestructionOrderRecorder *local_180;
  undefined1 local_178 [8];
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
  _kjCondition_2;
  bool _kj_shouldLog_1;
  size_t sStack_148;
  DebugExpression<unsigned_long> local_140;
  undefined1 local_138 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_1;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *pOStack_108;
  bool _kj_shouldLog;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *local_100;
  undefined1 local_f8 [8];
  DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*&>
  _kjCondition;
  undefined1 local_b8 [8];
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> combined;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *ptr;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> arr;
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  builder;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj3;
  undefined1 local_40 [8];
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj2;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj1;
  uint destroyed3;
  uint destroyed2;
  uint destroyed1;
  uint counter;
  TestCase445 *this_local;
  
  destroyed2 = 0;
  destroyed3 = 0;
  obj1.ptr._4_4_ = 0;
  obj1.ptr._0_4_ = 0;
  _destroyed1 = this;
  heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
            ((kj *)&obj2.ptr,&destroyed2,&destroyed3);
  heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
            ((kj *)local_40,&destroyed2,(uint *)((long)&obj1.ptr + 4));
  OVar3 = heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
                    ((kj *)&builder.disposer,&destroyed2,(uint *)&obj1.ptr);
  heapArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
              *)&arr.disposer,(kj *)0x1,(size_t)OVar3.ptr);
  pOVar2 = mv<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)
                      &obj2.ptr);
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>::
  add<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
              *)&arr.disposer,pOVar2);
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::
  finish((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *)
         &ptr,(ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
               *)&arr.disposer);
  combined.disposer =
       (ArrayDisposer *)
       Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::begin
                 ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
                   *)&ptr);
  pOVar2 = mv<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)
                      local_40);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>::
  attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )&_kjCondition.result,
             (Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )&ptr,pOVar2);
  pOVar2 = mv<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
                     ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)
                      &builder.disposer);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>::
  attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )local_b8,&_kjCondition.result,pOVar2);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::~Array
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )&_kjCondition.result);
  pOStack_108 = Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
                ::begin((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
                         *)local_b8);
  local_100 = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffef8);
  kj::_::
  DebugExpression<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>*>::
  operator==((DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*&>
              *)local_f8,
             (DebugExpression<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>*>
              *)&local_100,
             (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)
             &combined.disposer);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[41],kj::_::DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>*,kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>*&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1ce,ERROR,"\"failed: expected \" \"combined.begin() == ptr\", _kjCondition",
                 (char (*) [41])"failed: expected combined.begin() == ptr",
                 (DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*&>
                  *)local_f8);
      _kjCondition_1._39_1_ = 0;
    }
  }
  sStack_148 = Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
               ::size((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
                       *)local_b8);
  local_140 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffeb8);
  _kjCondition_2._36_4_ = 1;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_138,&local_140,
             (int *)&_kjCondition_2.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    _kjCondition_2._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1cf,ERROR,"\"failed: expected \" \"combined.size() == 1\", _kjCondition",
                 (char (*) [38])"failed: expected combined.size() == 1",
                 (DebugComparison<unsigned_long,_int> *)local_138);
      _kjCondition_2._35_1_ = 0;
    }
  }
  local_188 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::get
                        ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *
                         )&obj2.ptr);
  local_180 = (DestructionOrderRecorder *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_188);
  pvStack_190 = (void *)0x0;
  kj::_::DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*>::operator==
            ((DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
              *)local_178,
             (DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*> *)&local_180,
             &stack0xfffffffffffffe70);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_178);
  if (!bVar1) {
    _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1d1,ERROR,"\"failed: expected \" \"obj1.get() == nullptr\", _kjCondition",
                 (char (*) [39])"failed: expected obj1.get() == nullptr",
                 (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
                  *)local_178);
      _kjCondition_3._39_1_ = 0;
    }
  }
  local_1d0 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::get
                        ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *
                         )local_40);
  local_1c8 = (DestructionOrderRecorder *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1d0);
  pvStack_1d8 = (void *)0x0;
  kj::_::DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*>::operator==
            ((DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
              *)local_1c0,
             (DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*> *)&local_1c8,
             &stack0xfffffffffffffe28);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c0);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1d2,ERROR,"\"failed: expected \" \"obj2.get() == nullptr\", _kjCondition",
                 (char (*) [39])"failed: expected obj2.get() == nullptr",
                 (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
                  *)local_1c0);
      _kjCondition_4._39_1_ = 0;
    }
  }
  local_218 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::get
                        ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *
                         )&builder.disposer);
  local_210 = (DestructionOrderRecorder *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_218);
  pvStack_220 = (void *)0x0;
  kj::_::DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*>::operator==
            ((DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
              *)local_208,
             (DebugExpression<kj::(anonymous_namespace)::DestructionOrderRecorder*> *)&local_210,
             &stack0xfffffffffffffde0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_208);
  if (!bVar1) {
    _kjCondition_5._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1d3,ERROR,"\"failed: expected \" \"obj3.get() == nullptr\", _kjCondition",
                 (char (*) [39])"failed: expected obj3.get() == nullptr",
                 (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
                  *)local_208);
      _kjCondition_5._39_1_ = 0;
    }
  }
  DStack_258 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&destroyed3);
  _kjCondition_6._36_4_ = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_250,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffda8,
             (int *)&_kjCondition_6.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_250);
  if (!bVar1) {
    _kjCondition_6._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1d4,ERROR,"\"failed: expected \" \"destroyed1 == 0\", _kjCondition",
                 (char (*) [33])"failed: expected destroyed1 == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_250);
      _kjCondition_6._35_1_ = 0;
    }
  }
  DStack_290 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)((long)&obj1.ptr + 4)
                         );
  _kjCondition_7._36_4_ = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_288,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffd70,
             (int *)&_kjCondition_7.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_288);
  if (!bVar1) {
    _kjCondition_7._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1d5,ERROR,"\"failed: expected \" \"destroyed2 == 0\", _kjCondition",
                 (char (*) [33])"failed: expected destroyed2 == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_288);
      _kjCondition_7._35_1_ = 0;
    }
  }
  DStack_2c8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&obj1.ptr);
  _kjCondition_8._36_4_ = 0;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_2c0,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffd38,
             (int *)&_kjCondition_8.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2c0);
  if (!bVar1) {
    _kjCondition_8._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1d6,ERROR,"\"failed: expected \" \"destroyed3 == 0\", _kjCondition",
                 (char (*) [33])"failed: expected destroyed3 == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_2c0);
      _kjCondition_8._35_1_ = 0;
    }
  }
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::operator=
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )local_b8,(void *)0x0);
  DStack_300 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&destroyed3);
  _kjCondition_9._36_4_ = 1;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_2f8,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffd00,
             (int *)&_kjCondition_9.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2f8);
  if (!bVar1) {
    _kjCondition_9._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_9._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1da,ERROR,"\"failed: expected \" \"destroyed1 == 1\", _kjCondition, destroyed1",
                 (char (*) [33])"failed: expected destroyed1 == 1",
                 (DebugComparison<unsigned_int_&,_int> *)local_2f8,&destroyed3);
      _kjCondition_9._35_1_ = 0;
    }
  }
  DStack_338 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)((long)&obj1.ptr + 4)
                         );
  _kjCondition_10._36_4_ = 2;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_330,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffcc8,
             (int *)&_kjCondition_10.field_0x24);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
  if (!bVar1) {
    _kjCondition_10._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_10._35_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1db,ERROR,"\"failed: expected \" \"destroyed2 == 2\", _kjCondition, destroyed2",
                 (char (*) [33])"failed: expected destroyed2 == 2",
                 (DebugComparison<unsigned_int_&,_int> *)local_330,(uint *)((long)&obj1.ptr + 4));
      _kjCondition_10._35_1_ = 0;
    }
  }
  DStack_370 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uint *)&obj1.ptr);
  local_374 = 3;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_368,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffc90,&local_374);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_368);
  if (!bVar1) {
    local_375 = kj::_::Debug::shouldLog(ERROR);
    while (local_375 != false) {
      kj::_::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1dc,ERROR,"\"failed: expected \" \"destroyed3 == 3\", _kjCondition, destroyed3",
                 (char (*) [33])"failed: expected destroyed3 == 3",
                 (DebugComparison<unsigned_int_&,_int> *)local_368,(uint *)&obj1.ptr);
      local_375 = false;
    }
  }
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::~Array
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )local_b8);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::~Array
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )&ptr);
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::
  ~ArrayBuilder((ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
                 *)&arr.disposer);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)
             &builder.disposer);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)local_40);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&obj2.ptr);
  return;
}

Assistant:

TEST(Array, AttachNested) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto builder = kj::heapArrayBuilder<Own<DestructionOrderRecorder>>(1);
  builder.add(kj::mv(obj1));
  auto arr = builder.finish();
  auto ptr = arr.begin();

  Array<Own<DestructionOrderRecorder>> combined = arr.attach(kj::mv(obj2)).attach(kj::mv(obj3));

  KJ_EXPECT(combined.begin() == ptr);
  KJ_EXPECT(combined.size() == 1);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}